

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

RPCHelpMan * analyzepsbt(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string name_00;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_18;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  undefined4 in_stack_ffffffffffffec18;
  undefined4 uVar13;
  undefined4 in_stack_ffffffffffffec1c;
  undefined1 in_stack_ffffffffffffec20 [24];
  undefined8 in_stack_ffffffffffffec38;
  undefined8 in_stack_ffffffffffffec40;
  _Manager_type in_stack_ffffffffffffec48;
  undefined8 in_stack_ffffffffffffec50;
  undefined1 in_stack_ffffffffffffec58 [16];
  pointer in_stack_ffffffffffffec68;
  pointer pRVar14;
  pointer in_stack_ffffffffffffec70;
  pointer pRVar15;
  pointer in_stack_ffffffffffffec78;
  pointer pRVar16;
  pointer in_stack_ffffffffffffec80;
  pointer in_stack_ffffffffffffec88;
  pointer pRVar17;
  pointer in_stack_ffffffffffffec90;
  pointer pRVar18;
  pointer in_stack_ffffffffffffec98;
  pointer pRVar19;
  undefined8 in_stack_ffffffffffffeca0;
  pointer in_stack_ffffffffffffeca8;
  pointer pRVar20;
  pointer in_stack_ffffffffffffecb0;
  pointer pRVar21;
  pointer in_stack_ffffffffffffecb8;
  pointer pRVar22;
  _Invoker_type in_stack_ffffffffffffecc0;
  pointer in_stack_ffffffffffffecc8;
  pointer in_stack_ffffffffffffecd0;
  pointer in_stack_ffffffffffffecd8;
  undefined8 in_stack_ffffffffffffece0;
  pointer in_stack_ffffffffffffece8;
  pointer in_stack_ffffffffffffecf0;
  pointer in_stack_ffffffffffffecf8;
  allocator<char> local_12fc;
  allocator<char> local_12fb;
  allocator_type local_12fa;
  allocator_type local_12f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12f8;
  allocator<char> local_12db;
  allocator<char> local_12da;
  allocator_type local_12d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12d8;
  allocator<char> local_12ba;
  allocator<char> local_12b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12b8;
  allocator<char> local_129b;
  allocator<char> local_129a;
  allocator_type local_1299;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1298;
  allocator<char> local_127a;
  allocator<char> local_1279;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1278;
  allocator<char> local_125b;
  allocator<char> local_125a;
  allocator_type local_1259;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1258;
  allocator<char> local_123a;
  allocator<char> local_1239;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1238;
  allocator<char> local_121a;
  allocator<char> local_1219;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1218;
  allocator<char> local_11fa;
  allocator<char> local_11f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11f8;
  allocator<char> local_11da;
  allocator<char> local_11d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11d8;
  allocator<char> local_11ba;
  allocator<char> local_11b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11b8;
  allocator<char> local_119a;
  allocator<char> local_1199;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1198;
  allocator<char> local_117a;
  allocator<char> local_1179;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1178;
  allocator<char> local_115a;
  allocator<char> local_1159;
  RPCResults local_1158;
  allocator_type local_113b;
  allocator<char> local_113a;
  allocator<char> local_1139;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1138;
  allocator<char> local_111a;
  allocator<char> local_1119;
  string local_1118;
  string local_10f8;
  string local_10d8;
  char *local_10b8;
  size_type local_10b0;
  char local_10a8 [8];
  undefined8 uStack_10a0;
  string local_1098 [32];
  string local_1078 [32];
  string local_1058 [32];
  string local_1038 [8];
  undefined8 local_1030;
  string local_1018 [32];
  string local_ff8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb8;
  string local_f98 [32];
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  string local_f18 [32];
  string local_ef8 [32];
  string local_ed8 [32];
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [32];
  string local_e58 [32];
  RPCResult local_e38;
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [32];
  RPCResult local_d30;
  string local_ca8 [32];
  string local_c88 [32];
  RPCResult local_c68 [4];
  string local_a48 [32];
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  string local_9a8 [32];
  RPCResult local_988 [4];
  string local_768 [32];
  string local_748 [32];
  RPCResult local_728;
  string local_6a0 [32];
  string local_680 [32];
  RPCResult local_660 [4];
  RPCResult local_440;
  RPCResult local_3b8;
  string local_330 [32];
  string local_310 [32];
  RPCResult local_2f0;
  RPCArgOptions local_268;
  string local_220 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  string local_1a0 [32];
  RPCArg local_180;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"analyzepsbt",&local_1119);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "\nAnalyzes and provides information about the current status of a PSBT and its inputs\n"
             ,&local_111a);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"psbt",&local_1139);
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_220,"A base64 string of a PSBT",&local_113a);
  local_268.oneline_description._M_dataplus._M_p = (pointer)&local_268.oneline_description.field_2;
  local_268.skip_type_check = false;
  local_268.oneline_description._M_string_length = 0;
  local_268.oneline_description.field_2._M_local_buf[0] = '\0';
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_268._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec1c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec18;
  name._M_string_length = in_stack_ffffffffffffec20._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffec20._8_16_;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffec40;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffec38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffec48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffec50;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffec58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffec70;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffec78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffec80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffec88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffec90;
  description_18._M_string_length = in_stack_ffffffffffffeca0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec98;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeca8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffecb0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffecc0;
  opts._0_8_ = in_stack_ffffffffffffecb8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffecc8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffecd0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffecd8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffece0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffece8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffecf0;
  opts._64_8_ = in_stack_ffffffffffffecf8;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_18,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1138,__l,&local_113b);
  std::__cxx11::string::string<std::allocator<char>>(local_310,"",&local_1159);
  std::__cxx11::string::string<std::allocator<char>>(local_330,"",&local_115a);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"inputs",&local_1179);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"",&local_117a);
  std::__cxx11::string::string<std::allocator<char>>(local_748,"",&local_1199);
  std::__cxx11::string::string<std::allocator<char>>(local_768,"",&local_119a);
  std::__cxx11::string::string<std::allocator<char>>(local_9a8,"has_utxo",&local_11b9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9c8,"Whether a UTXO is provided",&local_11ba);
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec1c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec18;
  m_key_name._M_string_length = in_stack_ffffffffffffec20._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffec20._8_16_;
  description._M_string_length = in_stack_ffffffffffffec40;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffec68;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult(local_988,BOOL,m_key_name,description,inner,SUB81(local_9a8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_9e8,"is_final",&local_11d9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a08,"Whether the input is finalized",&local_11da);
  local_11f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec1c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec18;
  m_key_name_00._M_string_length = in_stack_ffffffffffffec20._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffec20._8_16_;
  description_00._M_string_length = in_stack_ffffffffffffec40;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_00.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult(local_988 + 1,BOOL,m_key_name_00,description_00,inner_00,SUB81(local_9e8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a28,"missing",&local_11f9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a48,"Things that are missing that are required to complete this input",
             &local_11fa);
  std::__cxx11::string::string<std::allocator<char>>(local_c88,"pubkeys",&local_1219);
  std::__cxx11::string::string<std::allocator<char>>(local_ca8,"",&local_121a);
  std::__cxx11::string::string<std::allocator<char>>(local_d50,"keyid",&local_1239);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d70,
             "Public key ID, hash160 of the public key, of a public key whose BIP 32 derivation path is missing"
             ,&local_123a);
  local_1258.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1258.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1258.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec1c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffec18;
  m_key_name_01._M_string_length = in_stack_ffffffffffffec20._0_8_;
  m_key_name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffec20._8_16_;
  description_01._M_string_length = in_stack_ffffffffffffec40;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_01.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult(&local_d30,STR_HEX,m_key_name_01,description_01,inner_01,SUB81(local_d50,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_d30;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1238,__l_00,&local_1259);
  uVar13 = 0;
  auVar1._4_24_ = in_stack_ffffffffffffec20;
  auVar1._0_4_ = in_stack_ffffffffffffec1c;
  auVar1._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffec40;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_02.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (local_c68,ARR,(string)(auVar1 << 0x20),SUB81(local_c88,0),description_02,inner_02,true)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_d90,"signatures",&local_125a);
  std::__cxx11::string::string<std::allocator<char>>(local_db0,"",&local_125b);
  std::__cxx11::string::string<std::allocator<char>>(local_e58,"keyid",&local_1279);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e78,
             "Public key ID, hash160 of the public key, of a public key whose signature is missing",
             &local_127a);
  local_1298.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1298.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1298.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec1c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_02._M_string_length = in_stack_ffffffffffffec20._0_8_;
  m_key_name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffec20._8_16_;
  description_03._M_string_length = in_stack_ffffffffffffec40;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_03.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult(&local_e38,STR_HEX,m_key_name_02,description_03,inner_03,SUB81(local_e58,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_e38;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1278,__l_01,&local_1299);
  auVar2._4_24_ = in_stack_ffffffffffffec20;
  auVar2._0_4_ = in_stack_ffffffffffffec1c;
  auVar2._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffec40;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_04.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (local_c68 + 1,ARR,(string)(auVar2 << 0x20),SUB81(local_d90,0),description_04,inner_04,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_e98,"redeemscript",&local_129a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_eb8,"Hash160 of the redeem script that is missing",&local_129b);
  local_12b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_24_ = in_stack_ffffffffffffec20;
  auVar3._0_4_ = in_stack_ffffffffffffec1c;
  auVar3._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffec40;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_05.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (local_c68 + 2,STR_HEX,(string)(auVar3 << 0x20),SUB81(local_e98,0),description_05,
             inner_05,true);
  std::__cxx11::string::string<std::allocator<char>>(local_ed8,"witnessscript",&local_12b9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ef8,"SHA256 of the witness script that is missing",&local_12ba);
  local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_24_ = in_stack_ffffffffffffec20;
  auVar4._0_4_ = in_stack_ffffffffffffec1c;
  auVar4._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffec40;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_06.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (local_c68 + 3,STR_HEX,(string)(auVar4 << 0x20),SUB81(local_ed8,0),description_06,
             inner_06,true);
  __l_02._M_len = 4;
  __l_02._M_array = local_c68;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1218,__l_02,&local_12d9);
  auVar5._4_24_ = in_stack_ffffffffffffec20;
  auVar5._0_4_ = in_stack_ffffffffffffec1c;
  auVar5._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffec40;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_07.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (local_988 + 2,OBJ,(string)(auVar5 << 0x20),SUB81(local_a28,0),description_07,inner_07,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_f18,"next",&local_12da);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f38,"Role of the next person that this input needs to go to",&local_12db);
  local_12f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar13 = 0;
  auVar6._4_24_ = in_stack_ffffffffffffec20;
  auVar6._0_4_ = in_stack_ffffffffffffec1c;
  auVar6._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffec40;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_08.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (local_988 + 3,STR,(string)(auVar6 << 0x20),SUB81(local_f18,0),description_08,inner_08,
             true);
  __l_03._M_len = 4;
  __l_03._M_array = local_988;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_11b8,__l_03,&local_12f9);
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec1c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_03._M_string_length = in_stack_ffffffffffffec20._0_8_;
  m_key_name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffec20._8_16_;
  description_09._M_string_length = in_stack_ffffffffffffec40;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_09.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult(&local_728,OBJ,m_key_name_03,description_09,inner_09,SUB81(local_748,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_728;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1198,__l_04,&local_12fa);
  auVar7._4_24_ = in_stack_ffffffffffffec20;
  auVar7._0_4_ = in_stack_ffffffffffffec1c;
  auVar7._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffec40;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_10.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (local_660,ARR,(string)(auVar7 << 0x20),SUB81(local_680,0),description_10,inner_10,true)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_f58,"estimated_vsize",&local_12fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f78,"Estimated vsize of the final signed transaction",&local_12fc);
  auVar8._4_24_ = in_stack_ffffffffffffec20;
  auVar8._0_4_ = in_stack_ffffffffffffec1c;
  auVar8._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffec40;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_11.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (local_660 + 1,NUM,(string)(auVar8 << 0x20),SUB81(local_f58,0),description_11,inner_11,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f98,"estimated_feerate",(allocator<char> *)&stack0xffffffffffffece7);
  std::operator+(&local_fd8,"Estimated feerate of the final signed transaction in ",
                 &CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_fb8,&local_fd8,
                 "/kvB. Shown only if all UTXO slots in the PSBT have been filled");
  auVar9._4_24_ = in_stack_ffffffffffffec20;
  auVar9._0_4_ = in_stack_ffffffffffffec1c;
  auVar9._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffec40;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_12.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (local_660 + 2,STR_AMOUNT,(string)(auVar9 << 0x20),SUB81(local_f98,0),description_12,
             inner_12,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ff8,"fee",(allocator<char> *)&stack0xffffffffffffecc7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1018,
             "The transaction fee paid. Shown only if all UTXO slots in the PSBT have been filled",
             (allocator<char> *)&stack0xffffffffffffecc6);
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  pRVar22 = (pointer)0x0;
  uVar13 = 0;
  auVar10._4_24_ = in_stack_ffffffffffffec20;
  auVar10._0_4_ = in_stack_ffffffffffffec1c;
  auVar10._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffec40;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_13.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (local_660 + 3,STR_AMOUNT,(string)(auVar10 << 0x20),SUB81(local_ff8,0),description_13,
             inner_13,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1038,"next",(allocator<char> *)&stack0xffffffffffffeca7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1058,"Role of the next person that this psbt needs to go to",
             (allocator<char> *)&stack0xffffffffffffeca6);
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec1c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_04._M_string_length = in_stack_ffffffffffffec20._0_8_;
  m_key_name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffec20._8_16_;
  description_14._M_string_length = in_stack_ffffffffffffec40;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_14.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult(&local_440,STR,m_key_name_04,description_14,inner_14,SUB81(local_1038,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1078,"error",(allocator<char> *)&stack0xffffffffffffec87);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1098,"Error message (if there is one)",
             (allocator<char> *)&stack0xffffffffffffec86);
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  uVar13 = 0;
  auVar11._4_24_ = in_stack_ffffffffffffec20;
  auVar11._0_4_ = in_stack_ffffffffffffec1c;
  auVar11._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffec40;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_15.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult
            (&local_3b8,STR,(string)(auVar11 << 0x20),SUB81(local_1078,0),description_15,inner_15,
             true);
  __l_05._M_len = 6;
  __l_05._M_array = local_660;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1178,__l_05,(allocator_type *)&stack0xffffffffffffec67);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffec1c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_05._M_string_length = in_stack_ffffffffffffec20._0_8_;
  m_key_name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffec20._8_16_;
  description_16._M_string_length = in_stack_ffffffffffffec40;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_16.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar14;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec58._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec58._8_8_;
  RPCResult::RPCResult(&local_2f0,OBJ,m_key_name_05,description_16,inner_16,SUB81(local_310,0));
  result._4_4_ = in_stack_ffffffffffffec1c;
  result.m_type = uVar13;
  result.m_key_name._0_24_ = in_stack_ffffffffffffec20;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffec38;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffec40;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffec48;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffec50;
  result.m_optional = (bool)in_stack_ffffffffffffec58[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffec58[1];
  result._66_6_ = in_stack_ffffffffffffec58._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec58._8_8_;
  result.m_description._M_string_length = (size_type)pRVar14;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar15;
  result.m_description.field_2._8_8_ = pRVar16;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec80;
  result.m_cond._M_string_length = (size_type)pRVar17;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar18;
  result.m_cond.field_2._8_8_ = pRVar19;
  RPCResults::RPCResults(&local_1158,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10f8,"analyzepsbt",(allocator<char> *)&stack0xffffffffffffec66);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1118,"\"psbt\"",(allocator<char> *)&stack0xffffffffffffec65);
  HelpExampleCli(&local_10d8,&local_10f8,&local_1118);
  local_10b8 = local_10a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8._M_dataplus._M_p == &local_10d8.field_2) {
    uStack_10a0 = local_10d8.field_2._8_8_;
  }
  else {
    local_10b8 = local_10d8._M_dataplus._M_p;
  }
  local_10b0 = local_10d8._M_string_length;
  local_10d8._M_string_length = 0;
  local_10d8.field_2._M_local_buf[0] = '\0';
  name_00._M_string_length = in_stack_ffffffffffffec20._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffec20._8_16_;
  name_00._M_dataplus._M_p = &stack0xffffffffffffec38;
  description_17.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp:1859:9)>
       ::_M_manager;
  description_17._M_dataplus._M_p = (pointer)0x0;
  description_17._M_string_length = 0;
  description_17.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp:1859:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar14;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffec58._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffec58._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar16;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar15;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffec80;
  examples.m_examples._M_string_length = (size_type)pRVar18;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar17;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar19;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffeca0;
  fun.super__Function_base._M_functor._8_8_ = pRVar21;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar20;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar22;
  fun._M_invoker = in_stack_ffffffffffffecc0;
  local_10d8._M_dataplus._M_p = (pointer)&local_10d8.field_2;
  RPCHelpMan::RPCHelpMan(in_RDI,name_00,description_17,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffec38);
  std::__cxx11::string::~string((string *)&local_10b8);
  std::__cxx11::string::~string((string *)&local_10d8);
  std::__cxx11::string::~string((string *)&local_1118);
  std::__cxx11::string::~string((string *)&local_10f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1158.m_results);
  RPCResult::~RPCResult(&local_2f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1178);
  lVar12 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_660[0].m_type + lVar12));
    lVar12 = lVar12 + -0x88;
  } while (lVar12 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec68);
  std::__cxx11::string::~string(local_1098);
  std::__cxx11::string::~string(local_1078);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec88);
  std::__cxx11::string::~string(local_1058);
  std::__cxx11::string::~string(local_1038);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeca8);
  std::__cxx11::string::~string(local_1018);
  std::__cxx11::string::~string(local_ff8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffecc8);
  std::__cxx11::string::~string((string *)&local_fb8);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::__cxx11::string::~string(local_f98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffece8);
  std::__cxx11::string::~string(local_f78);
  std::__cxx11::string::~string(local_f58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1198);
  RPCResult::~RPCResult(&local_728);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11b8);
  lVar12 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_988[0].m_type + lVar12));
    lVar12 = lVar12 + -0x88;
  } while (lVar12 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12f8);
  std::__cxx11::string::~string(local_f38);
  std::__cxx11::string::~string(local_f18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1218);
  lVar12 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_c68[0].m_type + lVar12));
    lVar12 = lVar12 + -0x88;
  } while (lVar12 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12d8);
  std::__cxx11::string::~string(local_ef8);
  std::__cxx11::string::~string(local_ed8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12b8);
  std::__cxx11::string::~string(local_eb8);
  std::__cxx11::string::~string(local_e98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1278);
  RPCResult::~RPCResult(&local_e38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1298);
  std::__cxx11::string::~string(local_e78);
  std::__cxx11::string::~string(local_e58);
  std::__cxx11::string::~string(local_db0);
  std::__cxx11::string::~string(local_d90);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1238);
  RPCResult::~RPCResult(&local_d30);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1258);
  std::__cxx11::string::~string(local_d70);
  std::__cxx11::string::~string(local_d50);
  std::__cxx11::string::~string(local_ca8);
  std::__cxx11::string::~string(local_c88);
  std::__cxx11::string::~string(local_a48);
  std::__cxx11::string::~string(local_a28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11f8);
  std::__cxx11::string::~string(local_a08);
  std::__cxx11::string::~string(local_9e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11d8);
  std::__cxx11::string::~string(local_9c8);
  std::__cxx11::string::~string(local_9a8);
  std::__cxx11::string::~string(local_768);
  std::__cxx11::string::~string(local_748);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_310);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1138);
  RPCArg::~RPCArg(&local_180);
  RPCArgOptions::~RPCArgOptions(&local_268);
  std::__cxx11::string::~string(local_220);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan analyzepsbt()
{
    return RPCHelpMan{"analyzepsbt",
            "\nAnalyzes and provides information about the current status of a PSBT and its inputs\n",
            {
                {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "A base64 string of a PSBT"}
            },
            RPCResult {
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::ARR, "inputs", /*optional=*/true, "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::BOOL, "has_utxo", "Whether a UTXO is provided"},
                            {RPCResult::Type::BOOL, "is_final", "Whether the input is finalized"},
                            {RPCResult::Type::OBJ, "missing", /*optional=*/true, "Things that are missing that are required to complete this input",
                            {
                                {RPCResult::Type::ARR, "pubkeys", /*optional=*/true, "",
                                {
                                    {RPCResult::Type::STR_HEX, "keyid", "Public key ID, hash160 of the public key, of a public key whose BIP 32 derivation path is missing"},
                                }},
                                {RPCResult::Type::ARR, "signatures", /*optional=*/true, "",
                                {
                                    {RPCResult::Type::STR_HEX, "keyid", "Public key ID, hash160 of the public key, of a public key whose signature is missing"},
                                }},
                                {RPCResult::Type::STR_HEX, "redeemscript", /*optional=*/true, "Hash160 of the redeem script that is missing"},
                                {RPCResult::Type::STR_HEX, "witnessscript", /*optional=*/true, "SHA256 of the witness script that is missing"},
                            }},
                            {RPCResult::Type::STR, "next", /*optional=*/true, "Role of the next person that this input needs to go to"},
                        }},
                    }},
                    {RPCResult::Type::NUM, "estimated_vsize", /*optional=*/true, "Estimated vsize of the final signed transaction"},
                    {RPCResult::Type::STR_AMOUNT, "estimated_feerate", /*optional=*/true, "Estimated feerate of the final signed transaction in " + CURRENCY_UNIT + "/kvB. Shown only if all UTXO slots in the PSBT have been filled"},
                    {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The transaction fee paid. Shown only if all UTXO slots in the PSBT have been filled"},
                    {RPCResult::Type::STR, "next", "Role of the next person that this psbt needs to go to"},
                    {RPCResult::Type::STR, "error", /*optional=*/true, "Error message (if there is one)"},
                }
            },
            RPCExamples {
                HelpExampleCli("analyzepsbt", "\"psbt\"")
            },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Unserialize the transaction
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, request.params[0].get_str(), error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    PSBTAnalysis psbta = AnalyzePSBT(psbtx);

    UniValue result(UniValue::VOBJ);
    UniValue inputs_result(UniValue::VARR);
    for (const auto& input : psbta.inputs) {
        UniValue input_univ(UniValue::VOBJ);
        UniValue missing(UniValue::VOBJ);

        input_univ.pushKV("has_utxo", input.has_utxo);
        input_univ.pushKV("is_final", input.is_final);
        input_univ.pushKV("next", PSBTRoleName(input.next));

        if (!input.missing_pubkeys.empty()) {
            UniValue missing_pubkeys_univ(UniValue::VARR);
            for (const CKeyID& pubkey : input.missing_pubkeys) {
                missing_pubkeys_univ.push_back(HexStr(pubkey));
            }
            missing.pushKV("pubkeys", std::move(missing_pubkeys_univ));
        }
        if (!input.missing_redeem_script.IsNull()) {
            missing.pushKV("redeemscript", HexStr(input.missing_redeem_script));
        }
        if (!input.missing_witness_script.IsNull()) {
            missing.pushKV("witnessscript", HexStr(input.missing_witness_script));
        }
        if (!input.missing_sigs.empty()) {
            UniValue missing_sigs_univ(UniValue::VARR);
            for (const CKeyID& pubkey : input.missing_sigs) {
                missing_sigs_univ.push_back(HexStr(pubkey));
            }
            missing.pushKV("signatures", std::move(missing_sigs_univ));
        }
        if (!missing.getKeys().empty()) {
            input_univ.pushKV("missing", std::move(missing));
        }
        inputs_result.push_back(std::move(input_univ));
    }
    if (!inputs_result.empty()) result.pushKV("inputs", std::move(inputs_result));

    if (psbta.estimated_vsize != std::nullopt) {
        result.pushKV("estimated_vsize", (int)*psbta.estimated_vsize);
    }
    if (psbta.estimated_feerate != std::nullopt) {
        result.pushKV("estimated_feerate", ValueFromAmount(psbta.estimated_feerate->GetFeePerK()));
    }
    if (psbta.fee != std::nullopt) {
        result.pushKV("fee", ValueFromAmount(*psbta.fee));
    }
    result.pushKV("next", PSBTRoleName(psbta.next));
    if (!psbta.error.empty()) {
        result.pushKV("error", psbta.error);
    }

    return result;
},
    };
}